

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_objects.cc
# Opt level: O3

shared_ptr<QPDFObject> __thiscall QPDF::getObjectForJSON(QPDF *this,int id,int gen)

{
  long lVar1;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var2;
  undefined8 uVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  _Rb_tree_iterator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_> _Var5;
  const_iterator cVar6;
  _Base_ptr p_Var7;
  int in_ECX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  undefined1 uVar9;
  undefined4 in_register_00000034;
  _Base_ptr p_Var10;
  pair<std::_Rb_tree_iterator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>,_bool> pVar11;
  shared_ptr<QPDFObject> sVar12;
  QPDFObjGen og;
  key_type local_30;
  
  p_Var10 = (_Base_ptr)CONCAT44(in_register_00000034,id);
  local_30.obj = gen;
  local_30.gen = in_ECX;
  pVar11 = std::
           map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
           ::try_emplace<>((map<QPDFObjGen,_QPDF::ObjCache,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDF::ObjCache>_>_>
                            *)(*(long *)p_Var10 + 0x1a8),&local_30);
  _Var8._M_pi = pVar11._8_8_;
  _Var5 = pVar11.first._M_node;
  if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
  goto LAB_00231f38;
  lVar1 = *(long *)p_Var10;
  if (*(char *)(lVar1 + 0x2d5) == '\x01') {
    cVar6 = std::
            _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_QPDFXRefEntry>,_std::_Select1st<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
            ::find((_Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_QPDFXRefEntry>,_std::_Select1st<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFXRefEntry>_>_>
                    *)(lVar1 + 0x138),&local_30);
    if (cVar6._M_node != (_Base_ptr)(lVar1 + 0x140)) goto LAB_00231ed9;
    uVar9 = 2;
  }
  else {
LAB_00231ed9:
    uVar9 = 0xd;
  }
  uVar3 = CONCAT44(local_30.gen,local_30.obj);
  p_Var7 = (_Base_ptr)operator_new(0x70);
  p_Var7->_M_parent = (_Base_ptr)0x100000001;
  *(undefined ***)p_Var7 = &PTR___Sp_counted_ptr_inplace_002ecaf0;
  *(undefined1 *)&p_Var7[2]._M_color = uVar9;
  p_Var7[2]._M_parent = (_Base_ptr)0x0;
  p_Var7[2]._M_left = (_Base_ptr)0x0;
  p_Var7[2]._M_right = p_Var10;
  *(undefined8 *)(p_Var7 + 3) = uVar3;
  p_Var7[3]._M_parent = (_Base_ptr)0xffffffffffffffff;
  _Var5._M_node[1]._M_parent = (_Base_ptr)&p_Var7->_M_left;
  p_Var10 = _Var5._M_node[1]._M_left;
  _Var5._M_node[1]._M_left = p_Var7;
  _Var8._M_pi = extraout_RDX;
  if (p_Var10 != (_Base_ptr)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var10);
    _Var8._M_pi = extraout_RDX_00;
  }
LAB_00231f38:
  (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
  super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
  super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl = (Members *)_Var5._M_node[1]._M_parent
  ;
  _Var2._M_head_impl = (Members *)_Var5._M_node[1]._M_left;
  this[1].m._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
  super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
  super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl = _Var2._M_head_impl;
  if (_Var2._M_head_impl != (Members *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&(_Var2._M_head_impl)->log + 8);
      *(int *)&p_Var4->_M_pi = *(int *)&p_Var4->_M_pi + 1;
      UNLOCK();
    }
    else {
      p_Var4 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&(_Var2._M_head_impl)->log + 8);
      *(int *)&p_Var4->_M_pi = *(int *)&p_Var4->_M_pi + 1;
    }
  }
  sVar12.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var8._M_pi;
  sVar12.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<QPDFObject>)sVar12.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<QPDFObject>
QPDF::getObjectForJSON(int id, int gen)
{
    auto og = QPDFObjGen(id, gen);
    auto [it, inserted] = m->obj_cache.try_emplace(og);
    auto& obj = it->second.object;
    if (inserted) {
        obj = (m->parsed && !m->xref_table.count(og))
            ? QPDFObject::create<QPDF_Null>(this, og)
            : QPDFObject::create<QPDF_Unresolved>(this, og);
    }
    return obj;
}